

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

uint rf_compile_shader(char *shader_str,int type)

{
  uint uVar1;
  int length;
  int max_len;
  int success;
  char log [1024];
  int local_484 [3];
  char *local_478;
  char *pcStack_470;
  undefined8 local_468;
  char *local_460;
  char *pcStack_458;
  undefined8 local_450;
  char *local_448;
  char *pcStack_440;
  undefined8 local_438;
  char *local_430;
  char local_428 [1032];
  
  local_430 = shader_str;
  uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.CreateShader)(type);
  (*(rf__ctx->field_0).gfx_ctx.gl.ShaderSource)(uVar1,1,&local_430,(int *)0x0);
  local_484[2] = 0;
  (*(rf__ctx->field_0).gfx_ctx.gl.CompileShader)(uVar1);
  (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(uVar1,0x8b81,local_484 + 2);
  if (local_484[2] == 1) {
    local_478 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_470 = "rf_compile_shader";
    local_468 = 0x97fa;
    rf_log_impl(2,0x17fae2,(char *)(ulong)uVar1);
  }
  else {
    local_448 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_440 = "rf_compile_shader";
    local_438 = 0x97ee;
    rf_log_impl(4,0x17fab9,(char *)(ulong)uVar1);
    local_484[1] = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(uVar1,0x8b84,local_484 + 1);
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderInfoLog)(uVar1,0x400,local_484,local_428);
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_458 = "rf_compile_shader";
    local_450 = 0x97f8;
    rf_log_impl(2,0x17d73c,local_428);
  }
  return uVar1;
}

Assistant:

RF_INTERNAL unsigned int rf_compile_shader(const char* shader_str, int type)
{
    unsigned int shader = rf_gl.CreateShader(type);
    rf_gl.ShaderSource(shader, 1, &shader_str, NULL);

    int success = 0;
    rf_gl.CompileShader(shader);
    rf_gl.GetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success != GL_TRUE)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "[SHDR ID %i] Failed to compile shader...", shader);
        int max_len = 0;
        int length;
        rf_gl.GetShaderiv(shader, GL_INFO_LOG_LENGTH, &max_len);

        //@Note: Buffer may not be big enough for some messages
        char log[1024];

        rf_gl.GetShaderInfoLog(shader, 1024, &length, log);

        RF_LOG(RF_LOG_TYPE_INFO, "%s", log);
    }
    else RF_LOG(RF_LOG_TYPE_INFO, "[SHDR ID %i] rf_shader compiled successfully", shader);

    return shader;
}